

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O0

void __thiscall Rml::DecoratorTiled::Tile::CalculateDimensions(Tile *this,Texture texture)

{
  Vector2<float> VVar1;
  float fVar2;
  float y;
  Vector2<float> *local_a8;
  Vector2f local_78;
  Vector2<float> local_70;
  Vector2<float> local_68;
  Vector2f size_relative;
  Vector2f local_58;
  Vector2f local_50;
  Vector2i local_48;
  Vector2<float> local_40;
  Vector2f texture_dimensions;
  Vector2f VStack_30;
  Vector2f local_28;
  Vector2<float> local_20;
  Tile *this_local;
  Texture texture_local;
  
  texture_local.render_manager = texture._8_8_;
  this_local = (Tile *)texture.render_manager;
  if ((this->tile_data_calculated & 1U) == 0) {
    this->tile_data_calculated = true;
    local_20 = (Vector2<float>)this;
    Vector2<float>::Vector2(&texture_dimensions);
    local_a8 = &VStack_30;
    do {
      Vector2<float>::Vector2(local_a8);
      local_a8 = local_a8 + 1;
    } while (local_a8 != &local_20);
    (this->tile_data).texcoords[1] = local_28;
    (this->tile_data).size = texture_dimensions;
    (this->tile_data).texcoords[0] = VStack_30;
    local_48 = Texture::GetDimensions((Texture *)&this_local);
    local_70 = Vector2::operator_cast_to_Vector2((Vector2 *)&local_48);
    local_40.x = local_70.x;
    local_40 = local_70;
    if ((local_40.x != 0.0) || (NAN(local_40.x))) {
      local_40.y = local_70.y;
      if ((local_40.y != 0.0) || (NAN(local_40.y))) {
        fVar2 = (this->size).x;
        if ((((((fVar2 != 0.0) || (NAN(fVar2))) || (fVar2 = (this->size).y, fVar2 != 0.0)) ||
             ((NAN(fVar2) || (fVar2 = (this->position).x, fVar2 != 0.0)))) || (NAN(fVar2))) ||
           ((fVar2 = (this->position).y, fVar2 != 0.0 || (NAN(fVar2))))) {
          (this->tile_data).size = this->size;
        }
        else {
          (this->tile_data).size.x = local_70.x;
          (this->tile_data).size.y = local_70.y;
        }
        local_68 = Vector2<float>::operator/(&(this->tile_data).size,local_70);
        fVar2 = Math::Absolute((this->tile_data).size.x);
        y = Math::Absolute((this->tile_data).size.y);
        Vector2<float>::Vector2(&local_78,fVar2,y);
        (this->tile_data).size = local_78;
        VVar1 = Vector2<float>::operator/(&this->position,local_40);
        (this->tile_data).texcoords[0].x = VVar1.x;
        (this->tile_data).texcoords[0].y = VVar1.y;
        VVar1.x = (this->tile_data).texcoords[0].x;
        VVar1.y = (this->tile_data).texcoords[0].y;
        VVar1 = Vector2<float>::operator+(&local_68,VVar1);
        (this->tile_data).texcoords[1] = VVar1;
        return;
      }
    }
    Vector2<float>::Vector2(&local_50,0.0,0.0);
    (this->tile_data).size = local_50;
    Vector2<float>::Vector2(&local_58,0.0,0.0);
    (this->tile_data).texcoords[0] = local_58;
    Vector2<float>::Vector2(&size_relative,0.0,0.0);
    (this->tile_data).texcoords[1] = size_relative;
  }
  return;
}

Assistant:

void DecoratorTiled::Tile::CalculateDimensions(Texture texture) const
{
	if (!tile_data_calculated)
	{
		tile_data_calculated = true;
		tile_data = {};

		const Vector2f texture_dimensions(texture.GetDimensions());
		if (texture_dimensions.x == 0 || texture_dimensions.y == 0)
		{
			tile_data.size = Vector2f(0, 0);
			tile_data.texcoords[0] = Vector2f(0, 0);
			tile_data.texcoords[1] = Vector2f(0, 0);
		}
		else
		{
			// Need to scale the coordinates to normalized units and 'size' to absolute size (pixels)
			if (size.x == 0 && size.y == 0 && position.x == 0 && position.y == 0)
				tile_data.size = texture_dimensions;
			else
				tile_data.size = size;

			const Vector2f size_relative = tile_data.size / texture_dimensions;

			tile_data.size = Vector2f(Math::Absolute(tile_data.size.x), Math::Absolute(tile_data.size.y));

			tile_data.texcoords[0] = position / texture_dimensions;
			tile_data.texcoords[1] = size_relative + tile_data.texcoords[0];
		}
	}
}